

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

void __thiscall
swutil::SharedPtr<KeyFileReader<NWN::ResRef16>_>::SharedPtr
          (SharedPtr<KeyFileReader<NWN::ResRef16>_> *this,KeyFileReader<NWN::ResRef16> *Ptr)

{
  LONG_PTR *pLVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  bad_alloc anon_var_0;
  LONG_PTR in_stack_ffffffffffffffc4;
  
  *in_RDI = 0;
  in_RDI[1] = in_RSI;
  if (in_RDI[1] != 0) {
    pLVar1 = SharedPtrAllocSharedState(in_stack_ffffffffffffffc4);
    *in_RDI = pLVar1;
  }
  return;
}

Assistant:

SharedPtr(
			 T *Ptr
			)
			: m_Ptr( Ptr ),
			  m_SharedState( NULL )
		{
			if (m_Ptr)
			{
				try
				{
					m_SharedState = SharedPtrAllocSharedState( 1 );
				}
				catch (std::bad_alloc)
				{
					//
					// If we failed to allocate the shared state, delete the pointer
					// that had been transferred to us.  This is consistent with the
					// documentation for std::shared_ptr.  However, it might be
					// better to only allocate on first copy instead of right away,
					// which avoids the problem altogether.
					//

					SharedPtrDeleterDelete( Ptr );
					throw;
				}
			}
		}